

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caseconvert.cpp
# Opt level: O3

ScalarFunction * duckdb::LowerFun::GetFunction(void)

{
  ScalarFunction *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  FunctionNullHandling null_handling;
  bind_lambda_function_t in_stack_ffffffffffffff28;
  allocator_type local_c9;
  scalar_function_t local_c8;
  LogicalType local_a8;
  LogicalType local_90;
  vector<duckdb::LogicalType,_true> local_78;
  string local_60;
  LogicalType local_40;
  
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"lower","");
  LogicalType::LogicalType(&local_90,VARCHAR);
  __l._M_len = 1;
  __l._M_array = &local_90;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_78,__l,
             &local_c9);
  LogicalType::LogicalType(&local_a8,VARCHAR);
  local_c8.super__Function_base._M_functor._8_8_ = 0;
  local_c8.super__Function_base._M_functor._M_unused._M_object = CaseConvertFunction<false>;
  local_c8._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_c8.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  null_handling = 0xf8;
  LogicalType::LogicalType(&local_40,INVALID);
  ScalarFunction::ScalarFunction
            (in_RDI,&local_60,&local_78,&local_a8,&local_c8,(bind_scalar_function_t)0x0,
             (bind_scalar_function_extended_t)0x0,CaseConvertPropagateStats<false>,
             (init_local_state_t)0x0,(LogicalType)ZEXT824(&local_40),CONSISTENT,null_handling,
             in_stack_ffffffffffffff28);
  LogicalType::~LogicalType(&local_40);
  if (local_c8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_c8.super__Function_base._M_manager)
              ((_Any_data *)&local_c8,(_Any_data *)&local_c8,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_a8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_78);
  LogicalType::~LogicalType(&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  return in_RDI;
}

Assistant:

ScalarFunction LowerFun::GetFunction() {
	return ScalarFunction("lower", {LogicalType::VARCHAR}, LogicalType::VARCHAR, CaseConvertFunction<false>, nullptr,
	                      nullptr, CaseConvertPropagateStats<false>);
}